

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder.c
# Opt level: O2

lzma_ret stream_encoder_update
                   (void *coder_ptr,lzma_allocator *allocator,lzma_filter *filters,
                   lzma_filter *reversed_filters)

{
  lzma_ret lVar1;
  undefined8 *puVar2;
  
  if (*coder_ptr < 2) {
    *(undefined1 *)((long)coder_ptr + 4) = 0;
    *(lzma_filter **)((long)coder_ptr + 0x70) = filters;
    lVar1 = block_encoder_init((lzma_stream_coder_conflict *)coder_ptr,allocator);
    *(long *)((long)coder_ptr + 0x70) = (long)coder_ptr + 0x120;
    if (lVar1 == LZMA_OK) {
      *(undefined1 *)((long)coder_ptr + 4) = 1;
LAB_00590844:
      for (puVar2 = (undefined8 *)((long)coder_ptr + 0x128); puVar2[-1] != -1; puVar2 = puVar2 + 2)
      {
        lzma_free((void *)*puVar2,allocator);
      }
      lVar1 = lzma_filters_copy(filters,(lzma_filter *)((long)coder_ptr + 0x120),allocator);
      return lVar1;
    }
  }
  else if (*coder_ptr < 4) {
    lVar1 = (**(code **)((long)coder_ptr + 0x48))
                      (*(undefined8 *)((long)coder_ptr + 8),allocator,filters);
    if (lVar1 == LZMA_OK) goto LAB_00590844;
  }
  else {
    lVar1 = LZMA_PROG_ERROR;
  }
  return lVar1;
}

Assistant:

static lzma_ret
stream_encoder_update(void *coder_ptr, const lzma_allocator *allocator,
		const lzma_filter *filters,
		const lzma_filter *reversed_filters)
{
	lzma_stream_coder *coder = coder_ptr;

	if (coder->sequence <= SEQ_BLOCK_INIT) {
		// There is no incomplete Block waiting to be finished,
		// thus we can change the whole filter chain. Start by
		// trying to initialize the Block encoder with the new
		// chain. This way we detect if the chain is valid.
		coder->block_encoder_is_initialized = false;
		coder->block_options.filters = (lzma_filter *)(filters);
		const lzma_ret ret = block_encoder_init(coder, allocator);
		coder->block_options.filters = coder->filters;
		if (ret != LZMA_OK)
			return ret;

		coder->block_encoder_is_initialized = true;

	} else if (coder->sequence <= SEQ_BLOCK_ENCODE) {
		// We are in the middle of a Block. Try to update only
		// the filter-specific options.
		return_if_error(coder->block_encoder.update(
				coder->block_encoder.coder, allocator,
				filters, reversed_filters));
	} else {
		// Trying to update the filter chain when we are already
		// encoding Index or Stream Footer.
		return LZMA_PROG_ERROR;
	}

	// Free the copy of the old chain and make a copy of the new chain.
	for (size_t i = 0; coder->filters[i].id != LZMA_VLI_UNKNOWN; ++i)
		lzma_free(coder->filters[i].options, allocator);

	return lzma_filters_copy(filters, coder->filters, allocator);
}